

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_range.c
# Opt level: O0

int utf8_range_IsValid(char *data,size_t len)

{
  char *end_00;
  char *data_00;
  size_t len_local;
  char *data_local;
  char *end;
  char *data_original;
  size_t local_10;
  
  if (len == 0) {
    local_10 = 1;
  }
  else {
    end_00 = data + len;
    data_00 = utf8_range_SkipAscii(data,end_00);
    if ((long)end_00 - (long)data_00 < 0x10) {
      local_10 = utf8_range_ValidateUTF8Naive(data_00,end_00,0);
    }
    else {
      local_10 = utf8_range_ValidateUTF8Naive(data_00,end_00,0);
    }
  }
  return (int)(local_10 != 0);
}

Assistant:

int utf8_range_IsValid(const char* data, size_t len) {
  return utf8_range_Validate(data, len, /*return_position=*/0) != 0;
}